

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestBaseAndMaxLevels::TextureViewTestBaseAndMaxLevels
          (TextureViewTestBaseAndMaxLevels *this,Context *context)

{
  Context *context_local;
  TextureViewTestBaseAndMaxLevels *this_local;
  
  deqp::TestCase::TestCase(&this->super_TestCase,context,"base_and_max_levels","test_description");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureViewTestBaseAndMaxLevels_0324b7a8;
  this->m_texture_height = 0x100;
  this->m_texture_n_components = 4;
  this->m_texture_n_levels = 6;
  this->m_texture_width = 0x100;
  this->m_view_height = 0x80;
  this->m_view_width = 0x80;
  this->m_layer_data_lod0 = (uchar *)0x0;
  this->m_layer_data_lod1 = (uchar *)0x0;
  this->m_fbo_id = 0;
  this->m_fs_id = 0;
  this->m_po_id = 0;
  this->m_po_lod_index_uniform_location = -1;
  this->m_po_to_sampler_uniform_location = -1;
  this->m_result_to_id = 0;
  this->m_to_id = 0;
  this->m_vao_id = 0;
  this->m_view_to_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

TextureViewTestBaseAndMaxLevels::TextureViewTestBaseAndMaxLevels(deqp::Context& context)
	: TestCase(context, "base_and_max_levels", "test_description")
	, m_texture_height(256)
	, m_texture_n_components(4)
	, m_texture_n_levels(6)
	, m_texture_width(256)
	, m_view_height(128)
	, m_view_width(128)
	, m_layer_data_lod0(DE_NULL)
	, m_layer_data_lod1(DE_NULL)
	, m_fbo_id(0)
	, m_fs_id(0)
	, m_po_id(0)
	, m_po_lod_index_uniform_location(-1)
	, m_po_to_sampler_uniform_location(-1)
	, m_result_to_id(0)
	, m_to_id(0)
	, m_vao_id(0)
	, m_view_to_id(0)
	, m_vs_id(0)
{
	/* Left blank on purpose */
}